

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::GetSpanVector(ON_PolyCurve *this,double *s)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ON_Curve *pOVar7;
  double dVar8;
  ON_Interval sp;
  ON_Interval segloc;
  bool local_69;
  ON_Interval local_50;
  ON_Interval local_40;
  
  ON_Interval::ON_Interval(&local_50);
  uVar4 = (ulong)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_69 = (long)uVar4 < 1;
  if ((0 < (long)uVar4) &&
     (pOVar7 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a, pOVar7 != (ON_Curve *)0x0))
  {
    uVar5 = 0;
    while ((iVar2 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(),
           iVar2 != 0 &&
           (pOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar5],
           iVar3 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])(pOVar7,s),
           (char)iVar3 != '\0'))) {
      pdVar1 = (this->m_t).m_a;
      ON_Interval::Set(&local_50,pdVar1[uVar5],pdVar1[uVar5 + 1]);
      pdVar1 = s + iVar2;
      ON_Interval::ON_Interval(&local_40,*s,*pdVar1);
      dVar8 = ON_Interval::Min(&local_50);
      if ((dVar8 != *s) || (NAN(dVar8) || NAN(*s))) {
        if (-1 < iVar2) goto LAB_0058f56a;
      }
      else {
        dVar8 = ON_Interval::Max(&local_50);
        if (-1 < iVar2 && dVar8 != *pdVar1) {
LAB_0058f56a:
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          uVar6 = 0;
          do {
            dVar8 = ON_Interval::NormalizedParameterAt(&local_40,s[uVar6]);
            dVar8 = ON_Interval::ParameterAt(&local_50,dVar8);
            s[uVar6] = dVar8;
            uVar6 = uVar6 + 1;
          } while (iVar2 + 1 != uVar6);
        }
      }
      uVar5 = uVar5 + 1;
      local_69 = uVar4 <= uVar5;
      if (uVar5 == uVar4) {
        return local_69;
      }
      pOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar5];
      s = pdVar1;
      if (pOVar7 == (ON_Curve *)0x0) {
        return local_69;
      }
    }
  }
  return local_69;
}

Assistant:

bool ON_PolyCurve::GetSpanVector( // span "knots" 
       double* s // array of length SpanCount() + 1 
       ) const
{
  ON_Interval sp;
  double t;
  const int segment_count = Count();
  int i, j, k;
  for ( i = 0; i < segment_count; i++  ) {
    if ( !m_segment[i] )
      return false;
    j = m_segment[i]->SpanCount();
    if ( j == 0 )
      return 0;
    if ( !m_segment[i]->GetSpanVector( s ) )
      return false;
    sp.Set( m_t[i], m_t[i+1] );
		ON_Interval segloc(s[0],s[j]);
    if ( sp.Min() != s[0] || sp.Max() != s[j] ) {
      for ( k = 0; k <= j; k++ ) {
        t = segloc.NormalizedParameterAt(s[k]);
        s[k] = sp.ParameterAt(t);
      }
    }

    s += j;
  }
  return true;
}